

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  char *pcVar1;
  byte *__nptr;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  long lVar9;
  __va_list_tag *p_Var10;
  size_t sVar11;
  long lVar12;
  long *plVar13;
  int *piVar14;
  double *pdVar15;
  uint uVar16;
  uint uVar17;
  double dVar18;
  size_t maxlength;
  long lVar19;
  uint *puVar20;
  double dVar21;
  ulong uVar22;
  byte *pbVar23;
  uint *unaff_R13;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  char *pcVar27;
  uint uVar28;
  bool bVar29;
  char formatbuf [32];
  char work [326];
  va_stack vto [128];
  char *endpos [128];
  double local_1608;
  long *local_15f0;
  char *local_15d8;
  uint *local_15d0;
  long *local_15c8;
  char *local_15c0;
  __va_list_tag *local_15b8;
  char *local_15b0;
  char local_15a8 [32];
  undefined8 local_1588;
  char local_1444 [12];
  int local_1438;
  undefined4 uStack_1434;
  undefined1 local_1430 [4];
  undefined1 auStack_142c [4];
  undefined8 local_1428;
  double local_1420 [509];
  long local_438 [129];
  
  bVar2 = *format;
  iVar4 = 0;
  local_1588 = (byte *)format;
  local_15b8 = ap_save;
  if (bVar2 != 0) {
    plVar13 = local_438;
    unaff_R13 = &switchD_004ee859::switchdataD_006dbea0;
    dVar18 = 0.0;
LAB_004ee7af:
    pbVar23 = local_1588 + 1;
    while (local_1588 = pbVar23, bVar2 == 0x25) {
      if (*local_1588 != 0x25) {
        iVar4 = iVar4 + 1;
        dVar6 = (double)dprintf_DollarString((char *)local_1588,(char **)&local_1588);
        dVar21 = (double)(long)iVar4;
        if (dVar6 != 0.0) {
          dVar21 = dVar6;
        }
        if ((long)dVar18 < (long)dVar21) {
          dVar18 = dVar21;
        }
        dVar6 = 0.0;
        local_1608 = 0.0;
        uVar28 = 0;
        pbVar23 = local_1588;
        goto switchD_004ee859_caseD_1;
      }
      bVar2 = local_1588[1];
      pbVar23 = local_1588 + 2;
      if (bVar2 == 0) {
        local_1588 = local_1588 + 1;
        goto LAB_004eecda;
      }
    }
    goto LAB_004eecbc;
  }
  dVar18 = 0.0;
LAB_004eecda:
  if (0 < (long)dVar18) {
    pdVar8 = local_1420;
    do {
      if (((ulong)*pdVar8 & 0x400000000000) != 0) {
        uVar28 = local_15b8->gp_offset;
        if ((ulong)uVar28 < 0x29) {
          piVar14 = (int *)((ulong)uVar28 + (long)local_15b8->reg_save_area);
          local_15b8->gp_offset = uVar28 + 8;
        }
        else {
          piVar14 = (int *)local_15b8->overflow_arg_area;
          local_15b8->overflow_arg_area = piVar14 + 2;
        }
        local_1420[(long)pdVar8[-2] * 4] = (double)(long)*piVar14;
      }
      if (((ulong)*pdVar8 & 0x1000000000000) != 0) {
        uVar28 = local_15b8->gp_offset;
        if ((ulong)uVar28 < 0x29) {
          piVar14 = (int *)((ulong)uVar28 + (long)local_15b8->reg_save_area);
          local_15b8->gp_offset = uVar28 + 8;
        }
        else {
          piVar14 = (int *)local_15b8->overflow_arg_area;
          local_15b8->overflow_arg_area = piVar14 + 2;
        }
        local_1420[(long)pdVar8[-1] * 4] = (double)(long)*piVar14;
      }
      switch(*(undefined4 *)(pdVar8 + -3)) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_004eed85_caseD_0:
        uVar28 = local_15b8->gp_offset;
        if ((ulong)uVar28 < 0x29) {
          pdVar15 = (double *)((ulong)uVar28 + (long)local_15b8->reg_save_area);
          local_15b8->gp_offset = uVar28 + 8;
        }
        else {
          pdVar15 = (double *)local_15b8->overflow_arg_area;
          local_15b8->overflow_arg_area = pdVar15 + 1;
        }
        dVar21 = *pdVar15;
        goto LAB_004eedac;
      case 3:
        uVar28 = *(uint *)((long)pdVar8 + -0x14);
        if ((((~uVar28 & 0x240) == 0) || ((uVar28 & 0x40) != 0)) || ((~uVar28 & 0x220) == 0))
        goto switchD_004eed85_caseD_0;
        uVar17 = local_15b8->gp_offset;
        uVar22 = (ulong)uVar17;
        if ((uVar28 & 0x20) == 0) {
          if ((uVar28 >> 9 & 1) == 0) {
            if (uVar17 < 0x29) {
              piVar14 = (int *)(uVar22 + (long)local_15b8->reg_save_area);
              local_15b8->gp_offset = uVar17 + 8;
            }
            else {
              piVar14 = (int *)local_15b8->overflow_arg_area;
              local_15b8->overflow_arg_area = piVar14 + 2;
            }
            dVar21 = (double)(long)*piVar14;
          }
          else {
            if (uVar17 < 0x29) {
              puVar20 = (uint *)(uVar22 + (long)local_15b8->reg_save_area);
              local_15b8->gp_offset = uVar17 + 8;
            }
            else {
              puVar20 = (uint *)local_15b8->overflow_arg_area;
              local_15b8->overflow_arg_area = puVar20 + 2;
            }
            dVar21 = (double)(ulong)*puVar20;
          }
        }
        else {
          if (uVar17 < 0x29) {
            pdVar15 = (double *)((long)local_15b8->reg_save_area + uVar22);
            local_15b8->gp_offset = uVar17 + 8;
          }
          else {
            pdVar15 = (double *)local_15b8->overflow_arg_area;
            local_15b8->overflow_arg_area = pdVar15 + 1;
          }
          dVar21 = *pdVar15;
        }
LAB_004eedac:
        *pdVar8 = dVar21;
        break;
      case 7:
        uVar28 = local_15b8->fp_offset;
        if ((ulong)uVar28 < 0xa1) {
          pdVar15 = (double *)((ulong)uVar28 + (long)local_15b8->reg_save_area);
          local_15b8->fp_offset = uVar28 + 0x10;
        }
        else {
          pdVar15 = (double *)local_15b8->overflow_arg_area;
          local_15b8->overflow_arg_area = pdVar15 + 1;
        }
        *pdVar8 = *pdVar15;
        break;
      case 9:
        *(undefined4 *)(pdVar8 + -3) = 3;
      }
      pdVar8 = pdVar8 + 4;
      dVar18 = (double)((long)dVar18 + -1);
    } while (dVar18 != 0.0);
  }
  local_15d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
  local_15f0 = local_438;
  local_15b8 = (__va_list_tag *)0x0;
  uVar28 = 0;
  local_15c8 = local_15f0;
  local_15c0 = format;
LAB_004eeecf:
  if (*local_15c0 == '%') {
    pcVar27 = local_15c0 + 1;
    if (local_15c0[1] != '%') {
      local_15c0 = pcVar27;
      lVar9 = dprintf_DollarString(pcVar27,&local_15c0);
      p_Var10 = (__va_list_tag *)(lVar9 + -1);
      if (lVar9 == 0) {
        p_Var10 = local_15b8;
      }
      lVar9 = (long)p_Var10 * 0x20;
      if (((uint)(&uStack_1434)[(long)p_Var10 * 8] >> 0xe & 1) == 0) {
        local_15b8 = (__va_list_tag *)((long)local_15b8 + 1);
        dVar18 = *(double *)(local_1430 + lVar9);
      }
      else {
        dVar18 = local_1420[*(long *)(local_1430 + lVar9) * 4];
        local_15b8 = (__va_list_tag *)((long)local_15b8 + 2);
        if ((long)dVar18 < 0) {
          dVar18 = (double)-(long)dVar18;
          (&uStack_1434)[(long)p_Var10 * 8] = (&uStack_1434)[(long)p_Var10 * 8] & 0xfffffefb | 4;
        }
      }
      uVar17 = (&uStack_1434)[(long)p_Var10 * 8];
      if ((uVar17 >> 0x10 & 1) == 0) {
        dVar21 = -NAN;
        if ((short)uVar17 < 0) {
          dVar21 = local_1420[(long)p_Var10 * 4 + -1];
        }
      }
      else {
        dVar21 = local_1420[(long)local_1420[(long)p_Var10 * 4 + -1] * 4];
        local_15b8 = (__va_list_tag *)((long)local_15b8 + 1);
        if ((long)dVar21 < 0) {
          dVar21 = -NAN;
        }
      }
      uVar16 = uVar28;
      if (6 < (&local_1438)[(long)p_Var10 * 8] - 1U) goto switchD_004ef03a_caseD_5;
      uVar25 = uVar17 >> 3 & 1;
      iVar4 = SUB84(dVar18,0);
      uVar26 = local_1608._0_4_;
      switch((&local_1438)[(long)p_Var10 * 8]) {
      case 1:
        local_15b0 = (char *)local_1420[(long)p_Var10 * 4];
        if (local_15b0 == (char *)0x0) {
          if (dVar21 == -NAN || 4 < (long)dVar21) {
            (&uStack_1434)[(long)p_Var10 * 8] = uVar17 & 0xfffffff7;
            dVar21 = 2.47032822920623e-323;
            local_15b0 = "(nil)";
          }
          else {
            local_15b0 = "";
LAB_004ef44e:
            dVar21 = 0.0;
          }
        }
        else if (dVar21 == -NAN) {
          if (*local_15b0 == '\0') goto LAB_004ef44e;
          dVar21 = (double)strlen(local_15b0);
        }
        dVar6 = NAN;
        if ((ulong)dVar21 < 0x7fffffffffffffff) {
          dVar6 = dVar21;
        }
        if ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 8) == 0) {
LAB_004ef490:
          lVar9 = (long)dVar18 - (long)dVar6;
          if ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 4) == 0) {
            if (lVar9 < 1) {
              lVar9 = lVar9 + -1;
            }
            else {
              iVar4 = iVar4 + uVar28;
              do {
                iVar5 = (*stream)(0x20,(FILE *)data);
                if (iVar5 == -1) goto LAB_004ef5d0;
                uVar28 = uVar28 + 1;
                lVar12 = lVar9 + -1;
                bVar29 = 0 < lVar9;
                lVar9 = lVar12;
              } while (lVar12 != 0 && bVar29);
              lVar9 = -1;
              uVar28 = iVar4 - SUB84(dVar6,0);
            }
          }
          if (dVar21 != 0.0) {
            dVar18 = 0.0;
            do {
              iVar4 = SUB84(dVar18,0);
              if (local_15b0[(long)dVar18] == '\0') break;
              iVar4 = (*stream)((int)local_15b0[(long)dVar18],(FILE *)data);
              if (iVar4 == -1) {
                uVar28 = uVar28 + SUB84(dVar18,0);
                goto LAB_004ef5d0;
              }
              dVar18 = (double)((long)dVar18 + 1);
              iVar4 = SUB84(dVar21,0);
            } while (dVar21 != dVar18);
            uVar28 = uVar28 + iVar4;
          }
          if (((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 4) != 0) && (0 < lVar9)) {
            uVar16 = uVar28 + (int)lVar9;
            lVar9 = lVar9 + 1;
            uVar17 = uVar28;
            do {
              uVar28 = uVar17;
              iVar4 = (*stream)(0x20,(FILE *)data);
              if (iVar4 == -1) goto LAB_004ef5d0;
              uVar17 = uVar28 + 1;
              lVar9 = lVar9 + -1;
              uVar28 = uVar16;
            } while (1 < lVar9);
          }
          bVar29 = true;
          if ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 8) != 0) {
            iVar4 = (*stream)(0x22,(FILE *)data);
            if (iVar4 == -1) goto LAB_004ef5d0;
            uVar28 = uVar28 + 1;
          }
        }
        else {
          iVar5 = (*stream)(0x22,(FILE *)data);
          if (iVar5 != -1) {
            uVar28 = uVar28 + 1;
            goto LAB_004ef490;
          }
LAB_004ef5d0:
          bVar29 = false;
          uVar26 = uVar28;
        }
        break;
      case 2:
        if ((uint *)local_1420[(long)p_Var10 * 4] == (uint *)0x0) {
          if ((uVar17 & 4) == 0) {
            dVar18 = (double)((long)dVar18 + -5);
          }
          else {
            dVar6 = (double)((long)dVar18 + -6);
            bVar29 = 5 < (long)dVar18;
            dVar18 = dVar6;
            if (bVar29) {
              iVar4 = uVar28 + iVar4;
              do {
                iVar5 = (*stream)(0x20,(FILE *)data);
                if (iVar5 == -1) goto LAB_004ef729;
                uVar28 = uVar28 + 1;
                bVar29 = 0 < (long)dVar18;
                dVar18 = (double)((long)dVar18 + -1);
              } while (bVar29);
              dVar18 = -NAN;
              uVar28 = iVar4 - 5;
            }
          }
          uVar16 = uVar28 + 5;
          cVar3 = '(';
          lVar12 = 0;
LAB_004ef696:
          iVar4 = (*stream)((int)cVar3,(FILE *)data);
          if (iVar4 != -1) goto code_r0x004ef6a7;
          uVar28 = uVar28 + (int)lVar12;
LAB_004ef729:
          uVar17 = 1;
          local_1608 = (double)(ulong)uVar28;
          uVar16 = uVar28;
          goto LAB_004ef744;
        }
        local_15d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar17 >> 0xc & 1) == 0) {
          local_15d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        local_15d0 = (uint *)0x10;
        local_15c8 = (long *)0x0;
        uVar25 = 1;
        uVar17 = 0x16;
        unaff_R13 = (uint *)local_1420[(long)p_Var10 * 4];
        goto LAB_004ef744;
      case 3:
        unaff_R13 = (uint *)local_1420[(long)p_Var10 * 4];
        if ((uVar17 >> 0x11 & 1) != 0) {
          if ((uVar17 & 4) == 0) {
            if ((long)dVar18 < 2) {
              dVar18 = (double)((long)dVar18 + -1);
            }
            else {
              iVar4 = uVar28 + iVar4;
              do {
                iVar5 = (*stream)(0x20,(FILE *)data);
                if (iVar5 == -1) goto LAB_004ef941;
                uVar28 = uVar28 + 1;
                dVar18 = (double)((long)dVar18 + -1);
              } while (1 < (long)dVar18);
              dVar18 = 0.0;
              uVar28 = iVar4 - 1;
            }
          }
          iVar4 = (*stream)((uint)unaff_R13 & 0xff,(FILE *)data);
          uVar17 = 1;
          if (iVar4 == -1) {
LAB_004ef941:
            uVar17 = 1;
            local_1608 = (double)(ulong)uVar28;
            goto LAB_004efa75;
          }
          uVar26 = uVar28 + 1;
          uVar16 = uVar26;
          if (((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 4) != 0) && (1 < (long)dVar18)) {
            uVar16 = uVar28 + SUB84(dVar18,0);
            lVar9 = (long)dVar18 + 1;
            do {
              iVar4 = (*stream)(0x20,(FILE *)data);
              if (iVar4 == -1) {
                local_1608 = (double)(ulong)uVar26;
                uVar28 = uVar26;
                goto LAB_004efa75;
              }
              uVar26 = uVar26 + 1;
              lVar9 = lVar9 + -1;
            } while (2 < lVar9);
          }
          goto switchD_004ef03a_caseD_5;
        }
        local_15d0 = (uint *)0x8;
        local_15c8 = (long *)0x0;
        if ((uVar17 >> 10 & 1) == 0) {
          if ((uVar17 >> 0xb & 1) == 0) {
            local_15d0 = (uint *)0xa;
            if ((uVar17 >> 9 & 1) == 0) {
              local_15c8 = (long *)((ulong)unaff_R13 >> 0x3f);
              if ((long)unaff_R13 < 1) {
                unaff_R13 = (uint *)-(long)unaff_R13;
              }
            }
          }
          else {
            local_15d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((uVar17 >> 0xc & 1) == 0) {
              local_15d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            local_15d0 = (uint *)0x10;
          }
        }
        goto LAB_004ef751;
      case 4:
        if ((uVar17 & 0x40) != 0) {
          *(long *)local_1420[(long)p_Var10 * 4] = (long)(int)uVar28;
          goto switchD_004ef03a_caseD_5;
        }
        if ((uVar17 & 0x20) == 0) {
          if ((uVar17 & 0x10) == 0) {
            *(uint *)local_1420[(long)p_Var10 * 4] = uVar28;
          }
          else {
            *(short *)local_1420[(long)p_Var10 * 4] = (short)uVar28;
          }
        }
        else {
          *(long *)local_1420[(long)p_Var10 * 4] = (long)(int)uVar28;
        }
        goto LAB_004efa5a;
      default:
        goto switchD_004ef03a_caseD_5;
      case 7:
        local_15a8[0x10] = '\0';
        local_15a8[0x11] = '\0';
        local_15a8[0x12] = '\0';
        local_15a8[0x13] = '\0';
        local_15a8[0x14] = '\0';
        local_15a8[0x15] = '\0';
        local_15a8[0x16] = '\0';
        local_15a8[0x17] = '\0';
        local_15a8[0x18] = '\0';
        local_15a8[0x19] = '\0';
        local_15a8[0x1a] = '\0';
        local_15a8[0x1b] = '\0';
        local_15a8[0x1c] = '\0';
        local_15a8[0x1d] = '\0';
        local_15a8[0x1e] = '\0';
        local_15a8[0x1f] = '\0';
        local_15a8[0] = '%';
        local_15a8[1] = '\0';
        local_15a8[2] = '\0';
        local_15a8[3] = '\0';
        local_15a8[4] = '\0';
        local_15a8[5] = '\0';
        local_15a8[6] = '\0';
        local_15a8[7] = '\0';
        local_15a8[8] = '\0';
        local_15a8[9] = '\0';
        local_15a8[10] = '\0';
        local_15a8[0xb] = '\0';
        local_15a8[0xc] = '\0';
        local_15a8[0xd] = '\0';
        local_15a8[0xe] = '\0';
        local_15a8[0xf] = '\0';
        sVar11 = strlen(local_15a8);
        if ((uVar17 >> 0xd & 1) == 0) {
          dVar18 = -NAN;
          if ((uVar17 >> 0xe & 1) != 0) {
            pdVar8 = local_1420 + *(long *)(local_1430 + lVar9) * 4;
            goto LAB_004ef20c;
          }
        }
        else {
          pdVar8 = (double *)(local_1430 + lVar9);
LAB_004ef20c:
          dVar18 = *pdVar8;
        }
        if ((short)uVar17 < 0) {
          dVar21 = local_1420[(long)p_Var10 * 4 + -1];
        }
        else {
          dVar21 = -NAN;
          if ((uVar17 >> 0x10 & 1) != 0) {
            dVar21 = local_1420[(long)local_1420[(long)p_Var10 * 4 + -1] * 4];
          }
        }
        pbVar23 = (byte *)(local_15a8 + 1);
        if ((uVar17 & 4) != 0) {
          local_15a8[1] = 0x2d;
          pbVar23 = (byte *)(local_15a8 + 2);
        }
        if ((uVar17 & 2) != 0) {
          *pbVar23 = 0x2b;
          pbVar23 = pbVar23 + 1;
        }
        if ((uVar17 & 1) != 0) {
          *pbVar23 = 0x20;
          pbVar23 = pbVar23 + 1;
        }
        if ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 8) != 0) {
          *pbVar23 = 0x23;
          pbVar23 = pbVar23 + 1;
        }
        maxlength = 0x20 - sVar11;
        *pbVar23 = 0;
        if (-1 < (long)dVar18) {
          if (0x144 < (long)dVar18) {
            dVar18 = 1.60571334898405e-321;
          }
          iVar4 = curl_msnprintf((char *)pbVar23,maxlength,"%ld");
          pbVar23 = pbVar23 + iVar4;
          maxlength = maxlength - (long)iVar4;
        }
        if (-1 < (long)dVar21) {
          dVar6 = local_1420[(long)p_Var10 * 4];
          lVar9 = 0x144 - (long)dVar18;
          if ((long)dVar18 < (long)dVar21) {
            lVar9 = 0x144;
          }
          if ((long)dVar18 < 1) {
            lVar9 = 0x144;
          }
          for (; 10.0 <= dVar6; dVar6 = dVar6 / 10.0) {
            lVar9 = lVar9 + -1;
          }
          dVar18 = (double)(lVar9 + -1);
          if ((long)dVar21 <= lVar9) {
            dVar18 = dVar21;
          }
          if ((long)dVar18 < 1) {
            dVar18 = 0.0;
          }
          iVar4 = curl_msnprintf((char *)pbVar23,maxlength,".%ld",dVar18);
          pbVar23 = pbVar23 + iVar4;
        }
        if ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 0x20) != 0) {
          *pbVar23 = 0x6c;
          pbVar23 = pbVar23 + 1;
        }
        uVar17 = (&uStack_1434)[(long)p_Var10 * 8];
        if ((uVar17 >> 0x12 & 1) == 0) {
          bVar2 = 0x66;
          if ((uVar17 >> 0x13 & 1) != 0) {
            bVar2 = ((uVar17 >> 0xc & 1) == 0) << 5 | 0x47;
          }
        }
        else {
          bVar2 = ((uVar17 >> 0xc & 1) == 0) << 5 | 0x45;
        }
        *pbVar23 = bVar2;
        pbVar23[1] = 0;
        sprintf((char *)&local_1588,local_15a8,SUB84(local_1420[(long)p_Var10 * 4],0));
        bVar29 = (char)local_1588 == '\0';
        if (!bVar29) {
          iVar4 = (*stream)((uint)local_1588 & 0xff,(FILE *)data);
          pcVar27 = (char *)((long)&local_1588 + 1);
          while (uVar26 = uVar28, iVar4 != -1) {
            uVar28 = uVar28 + 1;
            bVar29 = *pcVar27 == '\0';
            uVar26 = local_1608._0_4_;
            if (bVar29) break;
            iVar4 = (*stream)((int)*pcVar27,(FILE *)data);
            pcVar27 = pcVar27 + 1;
          }
        }
      }
      local_1608._0_4_ = uVar26;
      uVar17 = 1;
      uVar16 = uVar28;
      if (bVar29) goto LAB_004efa5a;
      goto LAB_004efa72;
    }
    local_15c0 = local_15c0 + 2;
    iVar4 = (*stream)(0x25,(FILE *)data);
    if (iVar4 != -1) {
      uVar17 = 0;
      uVar28 = uVar28 + 1;
      goto LAB_004efa75;
    }
    goto LAB_004ef078;
  }
  pcVar27 = local_15c0;
  if (*local_15c0 == '\0') {
    return uVar28;
  }
  do {
    iVar4 = (*stream)((int)*pcVar27,(FILE *)data);
    if (iVar4 == -1) {
      uVar17 = 1;
      local_1608 = (double)(ulong)uVar28;
      local_15c0 = pcVar27;
      goto LAB_004efa75;
    }
    uVar28 = uVar28 + 1;
    pcVar1 = pcVar27 + 1;
    pcVar27 = pcVar27 + 1;
  } while ((*pcVar1 != '\0') && (*pcVar1 != '%'));
  uVar17 = 0;
  local_15c0 = pcVar27;
  goto LAB_004efa75;
switchD_004ee859_caseD_1:
  local_1588 = pbVar23;
  __nptr = local_1588;
  bVar2 = *local_1588;
  uVar17 = bVar2 - 0x20;
  if (((0x2f < uVar17) || ((0x900003ff6c09U >> ((ulong)uVar17 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar2 - 0x68 || ((0x40211U >> (bVar2 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_004eea0b;
  pbVar23 = local_1588 + 1;
  if (bVar2 < 0x4c) {
    switch((ulong)uVar17) {
    case 0:
      uVar28 = uVar28 | 1;
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xf:
      break;
    case 3:
      uVar28 = uVar28 | 8;
      break;
    case 10:
      uVar28 = uVar28 | 0x4000;
      iVar4 = iVar4 + 1;
      local_1588 = pbVar23;
      dVar7 = (double)dprintf_DollarString((char *)pbVar23,(char **)&local_1588);
      dVar6 = (double)(long)iVar4;
      if (dVar7 != 0.0) {
        dVar6 = dVar7;
      }
      pbVar23 = local_1588;
      if ((long)dVar18 < (long)dVar6) {
        dVar18 = dVar6;
      }
      break;
    case 0xb:
      uVar28 = uVar28 | 2;
      break;
    case 0xd:
      uVar28 = uVar28 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar23 == 0x2a) {
        uVar28 = uVar28 | 0x10000;
        local_1588 = local_1588 + 2;
        iVar4 = iVar4 + 1;
        dVar7 = (double)dprintf_DollarString((char *)local_1588,(char **)&local_1588);
        local_1608 = (double)(long)iVar4;
        if (dVar7 != 0.0) {
          local_1608 = dVar7;
        }
        if ((long)dVar18 < (long)local_1608) {
          dVar18 = local_1608;
        }
      }
      else {
        uVar28 = uVar28 | 0x8000;
        local_1588 = pbVar23;
        local_1608 = (double)strtol((char *)pbVar23,(char **)&local_1588,10);
      }
      pbVar23 = local_1588;
      if ((~uVar28 & 0x18000) == 0) {
        return 0;
      }
      break;
    case 0x10:
      uVar28 = uVar28 | (~uVar28 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar28 = uVar28 | 0x2000;
      local_1588 = pbVar23;
      dVar6 = (double)strtol((char *)__nptr,(char **)&local_1588,10);
      pbVar23 = local_1588;
      break;
    default:
      if (bVar2 == 0) {
        pbVar23 = local_1588;
      }
    }
  }
  else if (bVar2 < 0x6c) {
    if (bVar2 == 0x4c) {
      uVar28 = uVar28 | 0x80;
    }
    else if (bVar2 == 0x4f) {
LAB_004ee9c9:
      uVar28 = uVar28 | 0x20;
    }
    else if (bVar2 == 0x68) {
      uVar28 = uVar28 | 0x10;
    }
  }
  else {
    if (bVar2 == 0x6c) {
      if ((uVar28 & 0x20) != 0) goto LAB_004ee9d2;
      goto LAB_004ee9c9;
    }
    if (bVar2 == 0x71) {
LAB_004ee9d2:
      uVar28 = uVar28 | 0x40;
    }
    else if (bVar2 == 0x7a) goto LAB_004ee9c9;
  }
  goto switchD_004ee859_caseD_1;
LAB_004eea0b:
  if ((long)dVar21 - 0x81U < 0xffffffffffffff80) {
    return 0;
  }
  lVar9 = (long)dVar21 + -1;
  if (0x57 < bVar2) {
    switch(bVar2) {
    case 99:
      (&local_1438)[lVar9 * 8] = 3;
      uVar28 = uVar28 | 0x20000;
      break;
    case 100:
    case 0x69:
      (&local_1438)[lVar9 * 8] = 3;
      break;
    case 0x65:
      (&local_1438)[lVar9 * 8] = 7;
      uVar28 = uVar28 | 0x40000;
      break;
    case 0x66:
      (&local_1438)[lVar9 * 8] = 7;
      break;
    case 0x67:
      (&local_1438)[lVar9 * 8] = 7;
      uVar28 = uVar28 | 0x80000;
      break;
    case 0x6e:
      (&local_1438)[lVar9 * 8] = 4;
      break;
    case 0x6f:
      (&local_1438)[lVar9 * 8] = 3;
      uVar28 = uVar28 | 0x400;
      break;
    case 0x70:
      (&local_1438)[lVar9 * 8] = 2;
      break;
    case 0x73:
switchD_004eea47_caseD_73:
      (&local_1438)[lVar9 * 8] = 1;
      break;
    case 0x75:
      (&local_1438)[lVar9 * 8] = 3;
      uVar28 = uVar28 | 0x200;
      break;
    case 0x78:
      (&local_1438)[lVar9 * 8] = 3;
      uVar28 = uVar28 | 0xa00;
      break;
    default:
      if (bVar2 == 0x58) {
        (&local_1438)[lVar9 * 8] = 3;
        uVar28 = uVar28 | 0x1a00;
        break;
      }
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_004eea47_caseD_68:
      (&local_1438)[lVar9 * 8] = 0;
    }
LAB_004eebef:
    (&uStack_1434)[lVar9 * 8] = uVar28;
    *(double *)(local_1430 + lVar9 * 0x20) = dVar6;
    local_1420[lVar9 * 4 + -1] = local_1608;
    if ((uVar28 >> 0xe & 1) != 0) {
      uVar22 = (long)dVar6 - 1;
      if (0x7f < uVar22) {
        return 0;
      }
      *(ulong *)(local_1430 + lVar9 * 0x20) = uVar22;
      (&local_1438)[uVar22 * 8] = 9;
      *(undefined8 *)(&uStack_1434 + uVar22 * 8) = 0;
      *(undefined8 *)(local_1430 + uVar22 * 0x20 + 4) = 0;
      *(undefined4 *)((long)local_1420 + uVar22 * 0x20 + -4) = 0;
    }
    if ((uVar28 >> 0x10 & 1) != 0) {
      dVar21 = (double)((long)local_1608 - 1);
      if (0x7f < (ulong)dVar21) {
        return 0;
      }
      local_1420[lVar9 * 4 + -1] = dVar21;
      (&local_1438)[(long)dVar21 * 8] = 9;
      *(undefined8 *)(&uStack_1434 + (long)dVar21 * 8) = 0;
      *(undefined8 *)(local_1430 + (long)dVar21 * 0x20 + 4) = 0;
      *(undefined4 *)((long)local_1420 + (long)dVar21 * 0x20 + -4) = 0;
    }
    *plVar13 = (long)(local_1588 + (*local_1588 != 0));
    plVar13 = plVar13 + 1;
LAB_004eecbc:
    bVar2 = *local_1588;
    if (bVar2 == 0) goto LAB_004eecda;
    goto LAB_004ee7af;
  }
  if (bVar2 == 0x45) {
    (&local_1438)[lVar9 * 8] = 7;
    uVar28 = uVar28 | 0x41000;
    goto LAB_004eebef;
  }
  if (bVar2 == 0x47) {
    (&local_1438)[lVar9 * 8] = 7;
    uVar28 = uVar28 | 0x81000;
    goto LAB_004eebef;
  }
  if (bVar2 == 0x53) {
    uVar28 = uVar28 | 8;
    goto switchD_004eea47_caseD_73;
  }
  goto switchD_004eea47_caseD_68;
code_r0x004ef6a7:
  cVar3 = "(nil)"[lVar12 + 1];
  lVar12 = lVar12 + 1;
  if (lVar12 == 5) goto code_r0x004ef6bb;
  goto LAB_004ef696;
code_r0x004ef6bb:
  uVar17 = 0;
  if ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 4) == 0) {
    if ((long)dVar18 < 1) {
      dVar18 = (double)((long)dVar18 + -1);
    }
    else {
      iVar4 = SUB84(dVar18,0);
      do {
        iVar5 = (*stream)(0x20,(FILE *)data);
        if (iVar5 == -1) {
          dVar18 = (double)((long)dVar18 + -1);
          uVar17 = 1;
          local_1608 = (double)(ulong)uVar16;
          goto LAB_004ef744;
        }
        uVar16 = uVar16 + 1;
        dVar6 = (double)((long)dVar18 + -1);
        bVar29 = 0 < (long)dVar18;
        dVar18 = dVar6;
      } while (dVar6 != 0.0 && bVar29);
      dVar18 = -NAN;
      uVar16 = uVar28 + iVar4 + 5;
    }
  }
LAB_004ef744:
  uVar28 = uVar16;
  uVar16 = uVar28;
  if (uVar17 == 0) {
switchD_004ef03a_caseD_5:
LAB_004efa5a:
    local_15c0 = (char *)*local_15f0;
    local_15f0 = local_15f0 + 1;
    uVar17 = 0;
    uVar28 = uVar16;
LAB_004efa72:
    local_1608 = (double)(ulong)local_1608._0_4_;
  }
  else {
    if (uVar17 != 0x16) goto LAB_004efa75;
LAB_004ef751:
    if (dVar21 == -NAN) {
      dVar21 = 4.94065645841247e-324;
    }
    uVar22 = 0x144;
    if (unaff_R13 == (uint *)0x0) {
      pcVar27 = local_1444;
    }
    else {
      do {
        uVar24 = uVar22;
        *(char *)((long)&local_1588 + uVar24) = local_15d8[(ulong)unaff_R13 % (ulong)local_15d0];
        uVar22 = uVar24 - 1;
        bVar29 = local_15d0 <= unaff_R13;
        unaff_R13 = (uint *)((ulong)unaff_R13 / (ulong)local_15d0);
      } while (bVar29);
      pcVar27 = local_15a8 + uVar24 + 0x1f;
    }
    lVar19 = (long)dVar18 - (0x144 - uVar22);
    lVar12 = (long)dVar21 - (0x144 - uVar22);
    uVar24 = uVar22;
    if (((uVar25 != 0) && (local_15d0 == (uint *)0x8)) && (lVar12 < 1)) {
      *pcVar27 = '0';
      lVar19 = lVar19 + -1;
      uVar24 = uVar22 - 1;
    }
    if ((0 < lVar12) && (lVar19 = lVar19 - lVar12, -1 < (long)uVar24)) {
      uVar22 = ((long)dVar21 + uVar22) - 0x145;
      if (uVar24 < uVar22) {
        uVar22 = uVar24;
      }
      memset((void *)((long)&local_1588 + (uVar24 - uVar22)),0x30,uVar22 + 1);
      uVar24 = uVar24 + ~uVar22;
    }
    bVar2 = local_15d0 == (uint *)0x10 & (byte)uVar25;
    lVar12 = lVar19 + -2;
    if (bVar2 == 0) {
      lVar12 = lVar19;
    }
    if (((int)local_15c8 != 0) || ((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 3) != 0)) {
      lVar12 = lVar12 + -1;
    }
    if ((*(ushort *)(&uStack_1434 + (long)p_Var10 * 8) & 0x104) == 0) {
      if (lVar12 < 1) {
        lVar12 = lVar12 + -1;
      }
      else {
        uVar17 = uVar28 + (int)lVar12;
        do {
          iVar4 = (*stream)(0x20,(FILE *)data);
          if (iVar4 == -1) {
            unaff_R13 = (uint *)0x0;
            goto LAB_004ef941;
          }
          uVar28 = uVar28 + 1;
          lVar19 = lVar12 + -1;
          bVar29 = 0 < lVar12;
          lVar12 = lVar19;
        } while (lVar19 != 0 && bVar29);
        lVar12 = -1;
        uVar28 = uVar17;
      }
    }
    if ((int)local_15c8 == 0) {
      if (((&uStack_1434)[(long)p_Var10 * 8] & 2) == 0) {
        if (((&uStack_1434)[(long)p_Var10 * 8] & 1) != 0) {
          iVar4 = 0x20;
          goto LAB_004ef8eb;
        }
        goto LAB_004ef8fe;
      }
      iVar4 = 0x2b;
LAB_004ef8eb:
      iVar4 = (*stream)(iVar4,(FILE *)data);
      if (iVar4 != -1) goto LAB_004ef8f6;
      local_15c8 = (long *)0x0;
    }
    else {
      iVar4 = (*stream)(0x2d,(FILE *)data);
      if (iVar4 != -1) {
LAB_004ef8f6:
        uVar28 = uVar28 + 1;
LAB_004ef8fe:
        if (bVar2 != 0) {
          iVar4 = (*stream)(0x30,(FILE *)data);
          uVar17 = 1;
          if (iVar4 == -1) {
            local_15d0 = (uint *)0x10;
            goto LAB_004ef969;
          }
          if ((*(byte *)((long)&uStack_1434 + lVar9 + 1) & 0x10) == 0) {
            iVar4 = 0x78;
          }
          else {
            iVar4 = 0x58;
          }
          iVar4 = (*stream)(iVar4,(FILE *)data);
          if (iVar4 == -1) {
            local_15d0 = (uint *)0x10;
            unaff_R13 = (uint *)0x0;
            local_1608 = (double)(ulong)(uVar28 + 1);
            uVar28 = uVar28 + 1;
            goto LAB_004efa75;
          }
          uVar28 = uVar28 + 2;
        }
        if (((&uStack_1434)[(long)p_Var10 * 8] & 0x104) == 0x100) {
          if (lVar12 < 1) {
            lVar12 = lVar12 + -1;
          }
          else {
            uVar17 = uVar28 + (int)lVar12;
            do {
              iVar4 = (*stream)(0x30,(FILE *)data);
              if (iVar4 == -1) goto LAB_004ef969;
              uVar28 = uVar28 + 1;
              lVar9 = lVar12 + -1;
              bVar29 = 0 < lVar12;
              lVar12 = lVar9;
            } while (lVar9 != 0 && bVar29);
            lVar12 = -1;
            uVar28 = uVar17;
          }
        }
        uVar17 = uVar28;
        if ((long)uVar24 < 0x144) {
          uVar17 = (uVar28 - (int)uVar24) + 0x144;
          do {
            iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1588 + uVar24 + 1),(FILE *)data);
            if (iVar4 == -1) goto LAB_004ef969;
            uVar24 = uVar24 + 1;
            uVar28 = uVar28 + 1;
          } while (uVar24 != 0x144);
        }
        uVar16 = uVar17;
        if (((*(byte *)(&uStack_1434 + (long)p_Var10 * 8) & 4) != 0) && (0 < lVar12)) {
          uVar16 = uVar17 + (int)lVar12;
          lVar12 = lVar12 + 1;
          uVar28 = uVar17;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) goto LAB_004ef969;
            uVar28 = uVar28 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
        unaff_R13 = (uint *)0x0;
        goto LAB_004efa5a;
      }
      local_15c8 = (long *)&DAT_00000001;
    }
LAB_004ef969:
    unaff_R13 = (uint *)0x0;
LAB_004ef078:
    uVar17 = 1;
    local_1608 = (double)(ulong)uVar28;
  }
LAB_004efa75:
  if ((uVar17 & 0x1d) != 0) {
    return local_1608._0_4_;
  }
  goto LAB_004eeecf;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num = 0; /* parameter counter */

  struct va_stack vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;
  char work[BUFFSIZE];
  struct va_stack *p;

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (false?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Do the actual %-code parsing */
  if(dprintf_Pass1(format, vto, endpos, ap_save))
    return 0;

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    unsigned long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    char *w;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param = dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM) {
      width = (long)vto[p->width].data.num.as_signed;
      param_num++; /* since the width is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        width = -width;
        p->flags |= FLAGS_LEFT;
        p->flags &= ~FLAGS_PAD_NIL;
      }
    }
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch(p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */

      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      while(num > 0) {
        *w-- = digits[num % base];
        num /= base;
      }
      width -= (long)(workend - w);
      prec -= (long)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
        --width;

      if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(p->flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(p->flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(p->flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(p->flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(!str) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else if(*str == '\0')
          len = 0;
        else
          len = strlen(str);

        width -= (len > LONG_MAX) ? LONG_MAX : (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        for(; len && *str; len--)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(!(p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          if(width >= (long)sizeof(work))
            width = sizeof(work)-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* for each digit in the integer part, we can have one less
             precision */
          size_t maxprec = sizeof(work) - 2;
          double val = p->data.dnum;
          if(width > 0 && prec <= width)
            maxprec -= width;
          while(val >= 10.0) {
            val /= 10;
            maxprec--;
          }

          if(prec > (long)maxprec)
            prec = (long)maxprec-1;
          if(prec < 0)
            prec = 0;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
#ifdef HAVE_SNPRINTF
        (snprintf)(work, sizeof(work), formatbuf, p->data.dnum);
#else
        (sprintf)(work, formatbuf, p->data.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
        DEBUGASSERT(strlen(work) <= sizeof(work));
        for(fptr = work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}